

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O1

void __thiscall SFFile::SetOrder(SFFile *this,int order,int drum,int bank,int program)

{
  uint uVar1;
  SFPerc *pSVar2;
  SFPreset *pSVar3;
  long lVar4;
  long lVar5;
  
  uVar1 = this->NumPresets;
  if (drum == 0) {
    if (0 < (int)uVar1) {
      lVar5 = 0x15;
      lVar4 = 0;
      do {
        pSVar3 = this->Presets;
        if (((uint)*(ushort *)(pSVar3->Name + lVar5 + 1) == program) &&
           ((uint)*(ushort *)(pSVar3->Name + lVar5 + 3) == bank)) {
          pSVar3->Name[lVar5] = pSVar3->Name[lVar5] & 0x80U | (byte)order & 0x7f;
        }
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x1c;
      } while (lVar4 < this->NumPresets);
    }
  }
  else if (0 < (int)uVar1) {
    pSVar2 = (this->Percussion).Array;
    lVar5 = 0;
    do {
      if (((uint)*(byte *)((long)&(pSVar2->Generators).field_0 + lVar5) == bank) &&
         ((uint)*(byte *)((long)&(pSVar2->Generators).field_0 + lVar5 + 1) == program)) {
        (&pSVar2->LoadOrder)[lVar5] = (byte)order;
      }
      lVar5 = lVar5 + 0x70;
    } while ((ulong)uVar1 * 0x70 - lVar5 != 0);
  }
  return;
}

Assistant:

void SFFile::SetOrder(int order, int drum, int bank, int program)
{
	if (drum)
	{
		for (int i = 0; i < NumPresets; ++i)
		{
			if (Percussion[i].Generators.drumset == bank && Percussion[i].Generators.key == program)
			{
				Percussion[i].LoadOrder = order;
			}
		}
	}
	else
	{
		for (int i = 0; i < NumPresets; ++i)
		{
			if (Presets[i].Program == program && Presets[i].Bank == bank)
			{
				Presets[i].LoadOrder = order;
			}
		}
	}
}